

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int archive_read_support_format_mtree(archive *_a)

{
  int iVar1;
  void *__s;
  archive *in_RDI;
  _func_int64_t_archive_read_ptr_int64_t_int *unaff_retaddr;
  _func_int_archive_read_ptr *in_stack_00000008;
  _func_int_archive_read_ptr *in_stack_00000010;
  _func_int_archive_read_ptr *in_stack_00000018;
  int magic_test;
  int r;
  mtree *mtree;
  archive_read *a;
  uint in_stack_00000050;
  uint in_stack_00000054;
  archive *in_stack_00000058;
  undefined4 in_stack_ffffffffffffffdc;
  archive *read_data;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  read_data = in_RDI;
  iVar1 = __archive_check_magic(in_stack_00000058,in_stack_00000054,in_stack_00000050,(char *)_a);
  if (iVar1 == -0x1e) {
    iVar1 = -0x1e;
  }
  else {
    __s = malloc(0x98);
    if (__s == (void *)0x0) {
      archive_set_error(in_RDI,0xc,"Can\'t allocate mtree data");
      iVar1 = -0x1e;
    }
    else {
      memset(__s,0,0x98);
      *(undefined4 *)((long)__s + 0x30) = 0xffffffff;
      iVar1 = __archive_read_register_format
                        ((archive_read *)CONCAT44(in_stack_ffffffffffffffdc,iVar1),(void *)0x0,
                         (char *)0x0,cleanup,(_func_int_archive_read_ptr_char_ptr_char_ptr *)0x0,
                         skip,(_func_int_archive_read_ptr_void_ptr_ptr_size_t_ptr_int64_t_ptr *)
                              read_data,
                         (_func_int_archive_read_ptr *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),unaff_retaddr
                         ,in_stack_00000008,in_stack_00000010,in_stack_00000018);
      if (iVar1 != 0) {
        free(__s);
      }
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int
archive_read_support_format_mtree(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct mtree *mtree;
	int r;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_read_support_format_mtree");

	mtree = (struct mtree *)malloc(sizeof(*mtree));
	if (mtree == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate mtree data");
		return (ARCHIVE_FATAL);
	}
	memset(mtree, 0, sizeof(*mtree));
	mtree->fd = -1;

	r = __archive_read_register_format(a, mtree, "mtree",
           mtree_bid, archive_read_format_mtree_options, read_header, read_data, skip, NULL, cleanup, NULL, NULL);

	if (r != ARCHIVE_OK)
		free(mtree);
	return (ARCHIVE_OK);
}